

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::LocalsWalker::CreateArgumentsObject(LocalsWalker *this,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  Type this_00;
  RecyclableObjectAddress *this_01;
  GlobalObject *_parentObj;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  FunctionBody *local_20;
  FunctionBody *pFBody;
  ResolvedObject *pResolvedObject_local;
  LocalsWalker *this_local;
  
  pFBody = (FunctionBody *)pResolvedObject;
  pResolvedObject_local = (ResolvedObject *)this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4a8,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((pFBody->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.ptr ==
      (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4a9,"(pResolvedObject->scriptContext)",
                                "pResolvedObject->scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->hasUserNotDefinedArguments & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4ab,"(hasUserNotDefinedArguments)","hasUserNotDefinedArguments");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr =
       (ScriptFunctionType *)0x1990954;
  *(undefined4 *)
   &(pFBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0x1cf;
  *(undefined4 *)
   &(pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr = 0x2a;
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[2])();
  local_20 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3))
  ;
  if (local_20 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4b2,"(pFBody)","pFBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[8])();
  (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr =
       (Utf8SourceInfo *)CONCAT44(extraout_var_00,iVar3);
  if ((pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr ==
      (Utf8SourceInfo *)0x0) {
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[9])();
    (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr =
         (Utf8SourceInfo *)CONCAT44(extraout_var_01,iVar3);
    if ((pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr ==
        (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x4b8,"(pResolvedObject->obj)","pResolvedObject->obj");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&RecyclableArgumentsObjectDisplay::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x4ba);
    pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            CONCAT44(extraout_var_02,iVar3),&local_48);
    local_58 = Memory::ArenaAllocator::Alloc;
    local_50 = 0;
    this_00 = (Type)new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar5,0x3f67b0);
    RecyclableArgumentsObjectDisplay::RecyclableArgumentsObjectDisplay
              ((RecyclableArgumentsObjectDisplay *)this_00,(ResolvedObject *)pFBody,this);
    (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext = this_00;
    ExpandArgumentsObject
              (this,(IDiagObjectModelDisplay *)
                    (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  }
  pAVar5 = &GetArenaFromContext((ScriptContext *)
                                (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.
                                ptr)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x4c3);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_80);
  this_01 = (RecyclableObjectAddress *)
            new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar5,0x3f67b0);
  _parentObj = ScriptContextBase::GetGlobalObject
                         ((ScriptContextBase *)
                          (((pFBody->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.ptr)->
                           offsets + 6));
  RecyclableObjectAddress::RecyclableObjectAddress
            (this_01,_parentObj,0x1cf,
             (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,0);
  (pFBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr =
       (FunctionInfo *)this_01;
  return 1;
}

Assistant:

BOOL LocalsWalker::CreateArgumentsObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);
        Assert(pResolvedObject->scriptContext);

        Assert(hasUserNotDefinedArguments);

        pResolvedObject->name = _u("arguments");
        pResolvedObject->propId = Js::PropertyIds::arguments;
        pResolvedObject->typeId = TypeIds_Arguments;

        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        pResolvedObject->obj = pFrame->GetArgumentsObject();
        if (pResolvedObject->obj == nullptr)
        {
            pResolvedObject->obj = pFrame->CreateHeapArguments();
            Assert(pResolvedObject->obj);

            pResolvedObject->objectDisplay = Anew(pFrame->GetArena(), RecyclableArgumentsObjectDisplay, pResolvedObject, this);
            ExpandArgumentsObject(pResolvedObject->objectDisplay);
        }

        pResolvedObject->address = Anew(GetArenaFromContext(pResolvedObject->scriptContext),
            RecyclableObjectAddress,
            pResolvedObject->scriptContext->GetGlobalObject(),
            Js::PropertyIds::arguments,
            pResolvedObject->obj,
            false /*isInDeadZone*/);

        return TRUE;
    }